

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::AnimatedLightNode> *node,ssize_t id)

{
  pointer pRVar1;
  int __oflag;
  ulong uVar2;
  allocator local_149;
  Ref<embree::SceneGraph::Node> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_c0,"AnimatedLight ",&local_149);
  std::operator+(&local_a0,&local_c0,"time_range=\"");
  std::__cxx11::to_string(&local_e0,(node->ptr->time_range).lower);
  std::operator+(&local_80,&local_a0,&local_e0);
  std::operator+(&local_60,&local_80," ");
  std::__cxx11::to_string(&local_100,(node->ptr->time_range).upper);
  std::operator+(&local_140,&local_60,&local_100);
  std::operator+(&local_40,&local_140,"\"");
  open(this,(char *)&local_40,__oflag);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  uVar2 = 0;
  while( true ) {
    pRVar1 = (node->ptr->lights).
             super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(node->ptr->lights).
                      super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) <= uVar2)
    break;
    local_148.ptr = &(pRVar1[uVar2].ptr)->super_Node;
    if (local_148.ptr != (Node *)0x0) {
      (*(((Node *)&(local_148.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
    }
    store(this,&local_148);
    if (local_148.ptr != (Node *)0x0) {
      (*(((Node *)&(local_148.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    uVar2 = uVar2 + 1;
  }
  std::__cxx11::string::string(local_120,"AnimatedLight",(allocator *)&local_140);
  close(this,(int)local_120);
  std::__cxx11::string::~string(local_120);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::AnimatedLightNode> node, ssize_t id)
  {
    open(std::string("AnimatedLight ")+
         "time_range=\""+std::to_string(node->time_range.lower)+" "+std::to_string(node->time_range.upper)+"\"");
    
    for (size_t i=0; i<node->lights.size(); i++)
      store(node->lights[i].dynamicCast<SceneGraph::Node>());
    
    close("AnimatedLight");
  }